

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_create_info.cpp
# Opt level: O3

unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true> __thiscall
duckdb::CreateSequenceInfo::Deserialize(CreateSequenceInfo *this,Deserializer *deserializer)

{
  undefined1 uVar1;
  uint uVar2;
  int iVar3;
  CreateSequenceInfo *this_00;
  pointer pCVar4;
  undefined4 extraout_var;
  int64_t iVar6;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  pointer *__ptr;
  _Head_base<0UL,_duckdb::CreateSequenceInfo_*,_false> local_58;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40 [16];
  uint64_t uVar5;
  undefined4 extraout_var_00;
  
  this_00 = (CreateSequenceInfo *)operator_new(0x178);
  CreateSequenceInfo(this_00);
  local_58._M_head_impl = this_00;
  pCVar4 = unique_ptr<duckdb::CreateSequenceInfo,_std::default_delete<duckdb::CreateSequenceInfo>,_true>
           ::operator->((unique_ptr<duckdb::CreateSequenceInfo,_std::default_delete<duckdb::CreateSequenceInfo>,_true>
                         *)&local_58);
  uVar2 = (*deserializer->_vptr_Deserializer[4])(deserializer,200,"name");
  if ((char)uVar2 == '\0') {
    local_48 = 0;
    local_40[0] = 0;
    local_50 = local_40;
    ::std::__cxx11::string::operator=((string *)&pCVar4->name,(string *)&local_50);
    if (local_50 == local_40) goto LAB_005b310a;
  }
  else {
    (*deserializer->_vptr_Deserializer[0x1a])(&local_50,deserializer);
    ::std::__cxx11::string::operator=((string *)&pCVar4->name,(string *)&local_50);
    if (local_50 == local_40) goto LAB_005b310a;
  }
  operator_delete(local_50);
LAB_005b310a:
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)(uVar2 & 0xff));
  pCVar4 = unique_ptr<duckdb::CreateSequenceInfo,_std::default_delete<duckdb::CreateSequenceInfo>,_true>
           ::operator->((unique_ptr<duckdb::CreateSequenceInfo,_std::default_delete<duckdb::CreateSequenceInfo>,_true>
                         *)&local_58);
  uVar2 = (*deserializer->_vptr_Deserializer[4])(deserializer,0xc9,"usage_count");
  if ((char)uVar2 == '\0') {
    uVar5 = 0;
  }
  else {
    iVar3 = (*deserializer->_vptr_Deserializer[0x15])(deserializer);
    uVar5 = CONCAT44(extraout_var,iVar3);
  }
  pCVar4->usage_count = uVar5;
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)(uVar2 & 0xff));
  pCVar4 = unique_ptr<duckdb::CreateSequenceInfo,_std::default_delete<duckdb::CreateSequenceInfo>,_true>
           ::operator->((unique_ptr<duckdb::CreateSequenceInfo,_std::default_delete<duckdb::CreateSequenceInfo>,_true>
                         *)&local_58);
  uVar2 = (*deserializer->_vptr_Deserializer[4])(deserializer,0xca,"increment");
  if ((char)uVar2 == '\0') {
    iVar6 = 0;
  }
  else {
    iVar3 = (*deserializer->_vptr_Deserializer[0x14])(deserializer);
    iVar6 = CONCAT44(extraout_var_00,iVar3);
  }
  pCVar4->increment = iVar6;
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)(uVar2 & 0xff));
  pCVar4 = unique_ptr<duckdb::CreateSequenceInfo,_std::default_delete<duckdb::CreateSequenceInfo>,_true>
           ::operator->((unique_ptr<duckdb::CreateSequenceInfo,_std::default_delete<duckdb::CreateSequenceInfo>,_true>
                         *)&local_58);
  uVar2 = (*deserializer->_vptr_Deserializer[4])(deserializer,0xcb,"min_value");
  if ((char)uVar2 == '\0') {
    iVar6 = 0;
  }
  else {
    iVar3 = (*deserializer->_vptr_Deserializer[0x14])(deserializer);
    iVar6 = CONCAT44(extraout_var_01,iVar3);
  }
  pCVar4->min_value = iVar6;
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)(uVar2 & 0xff));
  pCVar4 = unique_ptr<duckdb::CreateSequenceInfo,_std::default_delete<duckdb::CreateSequenceInfo>,_true>
           ::operator->((unique_ptr<duckdb::CreateSequenceInfo,_std::default_delete<duckdb::CreateSequenceInfo>,_true>
                         *)&local_58);
  uVar2 = (*deserializer->_vptr_Deserializer[4])(deserializer,0xcc,"max_value");
  if ((char)uVar2 == '\0') {
    iVar6 = 0;
  }
  else {
    iVar3 = (*deserializer->_vptr_Deserializer[0x14])(deserializer);
    iVar6 = CONCAT44(extraout_var_02,iVar3);
  }
  pCVar4->max_value = iVar6;
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)(uVar2 & 0xff));
  pCVar4 = unique_ptr<duckdb::CreateSequenceInfo,_std::default_delete<duckdb::CreateSequenceInfo>,_true>
           ::operator->((unique_ptr<duckdb::CreateSequenceInfo,_std::default_delete<duckdb::CreateSequenceInfo>,_true>
                         *)&local_58);
  uVar2 = (*deserializer->_vptr_Deserializer[4])(deserializer,0xcd,"start_value");
  if ((char)uVar2 == '\0') {
    iVar6 = 0;
  }
  else {
    iVar3 = (*deserializer->_vptr_Deserializer[0x14])(deserializer);
    iVar6 = CONCAT44(extraout_var_03,iVar3);
  }
  pCVar4->start_value = iVar6;
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)(uVar2 & 0xff));
  pCVar4 = unique_ptr<duckdb::CreateSequenceInfo,_std::default_delete<duckdb::CreateSequenceInfo>,_true>
           ::operator->((unique_ptr<duckdb::CreateSequenceInfo,_std::default_delete<duckdb::CreateSequenceInfo>,_true>
                         *)&local_58);
  uVar2 = (*deserializer->_vptr_Deserializer[4])(deserializer,0xce,"cycle");
  if ((char)uVar2 == '\0') {
    uVar1 = false;
  }
  else {
    iVar3 = (*deserializer->_vptr_Deserializer[0xc])(deserializer);
    uVar1 = (undefined1)iVar3;
  }
  pCVar4->cycle = (bool)uVar1;
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)(uVar2 & 0xff));
  (this->super_CreateInfo).super_ParseInfo._vptr_ParseInfo = (_func_int **)local_58._M_head_impl;
  return (unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>)
         (unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>)this;
}

Assistant:

unique_ptr<CreateInfo> CreateSequenceInfo::Deserialize(Deserializer &deserializer) {
	auto result = duckdb::unique_ptr<CreateSequenceInfo>(new CreateSequenceInfo());
	deserializer.ReadPropertyWithDefault<string>(200, "name", result->name);
	deserializer.ReadPropertyWithDefault<uint64_t>(201, "usage_count", result->usage_count);
	deserializer.ReadPropertyWithDefault<int64_t>(202, "increment", result->increment);
	deserializer.ReadPropertyWithDefault<int64_t>(203, "min_value", result->min_value);
	deserializer.ReadPropertyWithDefault<int64_t>(204, "max_value", result->max_value);
	deserializer.ReadPropertyWithDefault<int64_t>(205, "start_value", result->start_value);
	deserializer.ReadPropertyWithDefault<bool>(206, "cycle", result->cycle);
	return std::move(result);
}